

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

void TestCopy(void)

{
  _Map_pointer ppCVar1;
  ulong uVar2;
  element_type *peVar3;
  int iVar4;
  size_type size;
  undefined1 local_188 [8];
  size_type bufsize_2;
  int local_178;
  uint uStack_174;
  InputBuffer ib_4;
  size_type bufsize;
  assertion_result local_140;
  lazy_ostream local_128;
  _Elt_pointer local_118;
  _Elt_pointer local_110;
  OutputBuffer wb;
  OutputBuffer wb_3;
  InputBuffer ib;
  assertion_result local_d0;
  _Elt_pointer local_b8;
  undefined8 local_b0;
  element_type *local_a8;
  BufferReader local_a0;
  string msg;
  
  ib_4.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  ib_4.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&ib_4);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_128._vptr_lazy_ostream = (_func_int **)CONCAT71(local_128._vptr_lazy_ostream._1_7_,1);
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd8b8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_a0.iter_._M_first = (_Elt_pointer)0x1b4853;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)&local_a0);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_128);
  makeString_abi_cxx11_(&msg,0x1e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test1\n",6);
  avro::OutputBuffer::OutputBuffer(&wb,0);
  avro::detail::BufferImpl::writeTo(wb.pimpl_.px,msg._M_dataplus._M_p,msg._M_string_length);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x358;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])msg._M_string_length;
  bufsize_2 = (wb.pimpl_.px)->size_;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(msg._M_string_length == bufsize_2);
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x358,CHECK,CHECK_EQUAL,2,"msg.size()",
             &local_a0,"wb.size()",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x359;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_188._0_4_ = iVar4;
  bufsize_2 = CONCAT44(bufsize_2._4_4_,1);
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 1);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd878;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_a8 = (element_type *)&PTR__lazy_ostream_001dd878;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd878;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x359,CHECK,CHECK_EQUAL,2,
             "wb.numDataChunks()",&local_a0,"1",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x35b;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])(0x1000 - msg._M_string_length);
  bufsize_2 = (wb.pimpl_.px)->freeSpace_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_188 == (undefined1  [8])bufsize_2);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x35b,CHECK,CHECK_EQUAL,2,
             "kDefaultBlockSize - msg.size()",&local_a0,"wb.freeSpace()",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_a0.bufferImpl_.px = wb.pimpl_.px;
  local_a0.bufferImpl_.pn.pi_ = wb.pimpl_.pn.pi_;
  if (wb.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (wb.pimpl_.pn.pi_)->use_count_ = (wb.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_a0.iter_._M_cur =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_a0.iter_._M_first =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_a0.iter_._M_last =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_a0.iter_._M_node =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_a0.bytes_ = (wb.pimpl_.px)->size_;
  local_a0.chunkPos_ = 0;
  local_a0.bytesRemaining_ = local_a0.bytes_;
  avro::BufferReader::seek(&local_a0,5);
  avro::BufferReader::copyData((BufferReader *)&ib,(size_type)&local_a0);
  printBuffer(&ib);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x364;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((ib.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ib.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ib.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ib.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ib.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ib.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_188 = (undefined1  [8])&bufsize;
  bufsize = CONCAT44(bufsize._4_4_,iVar4);
  bufsize_2 = (size_type)&stack0xfffffffffffffe88;
  local_178 = 1;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = local_a8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x364,CHECK,CHECK_EQUAL,2,
             "ib.numChunks()",(begin *)&ib_4,"1",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x365;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  bufsize = (ib.pimpl_.px)->size_;
  _local_178 = (sp_counted_base *)(msg._M_string_length - 10);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((sp_counted_base *)bufsize == _local_178);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&bufsize;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  bufsize_2 = (size_type)&stack0xfffffffffffffe88;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x365,CHECK,CHECK_EQUAL,2,
             "ib.size()",(begin *)&ib_4,"msg.size()-10",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x368;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  bufsize = msg._M_string_length;
  _local_178 = (sp_counted_base *)(wb.pimpl_.px)->size_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((sp_counted_base *)msg._M_string_length == _local_178);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&bufsize;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  bufsize_2 = (size_type)&stack0xfffffffffffffe88;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x368,CHECK,CHECK_EQUAL,2,
             "msg.size()",(begin *)&ib_4,"wb.size()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x369;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  bufsize = CONCAT44(bufsize._4_4_,iVar4);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 1);
  local_178 = 1;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_128.m_empty = false;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&bufsize;
  ib_4.pimpl_.px = local_a8;
  bufsize_2 = (size_type)&stack0xfffffffffffffe88;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x369,CHECK,CHECK_EQUAL,2,
             "wb.numDataChunks()",(begin *)&ib_4,"1",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x36b;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  bufsize = 0x1000 - msg._M_string_length;
  _local_178 = (sp_counted_base *)(wb.pimpl_.px)->freeSpace_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((sp_counted_base *)bufsize == _local_178);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&bufsize;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  bufsize_2 = (size_type)&stack0xfffffffffffffe88;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x36b,CHECK,CHECK_EQUAL,2,
             "kDefaultBlockSize - msg.size()",(begin *)&ib_4,"wb.freeSpace()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  peVar3 = wb.pimpl_.px;
  uVar2 = (wb.pimpl_.px)->freeSpace_;
  while (uVar2 < 0x1000) {
    avro::detail::BufferImpl::allocChunkChecked(peVar3,0x1000);
    uVar2 = peVar3->freeSpace_;
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x36f;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  bufsize = (wb.pimpl_.px)->size_;
  _local_178 = (sp_counted_base *)msg._M_string_length;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&bufsize;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  bufsize_2 = (size_type)&stack0xfffffffffffffe88;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bufsize == msg._M_string_length);
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x36f,CHECK,CHECK_EQUAL,2,
             "wb.size()",(begin *)&ib_4,"msg.size()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x370;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  bufsize = CONCAT44(bufsize._4_4_,iVar4);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 2);
  local_178 = 2;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_128.m_empty = false;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&bufsize;
  ib_4.pimpl_.px = local_a8;
  bufsize_2 = (size_type)&stack0xfffffffffffffe88;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x370,CHECK,CHECK_EQUAL,2,
             "wb.numChunks()",(begin *)&ib_4,"2",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x372;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  bufsize = 0x2000 - msg._M_string_length;
  _local_178 = (sp_counted_base *)(wb.pimpl_.px)->freeSpace_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((sp_counted_base *)bufsize == _local_178);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&bufsize;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  bufsize_2 = (size_type)&stack0xfffffffffffffe88;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x372,CHECK,CHECK_EQUAL,2,
             "kDefaultBlockSize * 2 - msg.size()",(begin *)&ib_4,"wb.freeSpace()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&local_a0.bufferImpl_.pn);
  boost::detail::shared_count::~shared_count(&wb.pimpl_.pn);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test2\n",6);
  bufsize = 0xc000;
  avro::OutputBuffer::OutputBuffer(&wb,0xc000);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37c;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_188._0_4_ = iVar4;
  bufsize_2 = CONCAT44(bufsize_2._4_4_,3);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.px = local_a8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.px = local_a8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 3);
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x37c,CHECK,CHECK_EQUAL,2,
             "wb.numChunks()",&local_a0,"3",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37d;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])(wb.pimpl_.px)->freeSpace_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188 == (undefined1  [8])bufsize);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x37d,CHECK,CHECK_EQUAL,2,
             "wb.freeSpace()",&local_a0,"bufsize",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  avro::detail::BufferImpl::writeTo(wb.pimpl_.px,msg._M_dataplus._M_p,msg._M_string_length);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x381;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])(wb.pimpl_.px)->size_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188 == (undefined1  [8])msg._M_string_length);
  bufsize_2 = msg._M_string_length;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x381,CHECK,CHECK_EQUAL,2,"wb.size()",
             &local_a0,"msg.size()",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x382;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_188._0_4_ = iVar4;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 1);
  bufsize_2 = CONCAT44(bufsize_2._4_4_,1);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.px = local_a8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.px = local_a8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x382,CHECK,CHECK_EQUAL,2,
             "wb.numDataChunks()",&local_a0,"1",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 900;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])(0xc000 - msg._M_string_length);
  bufsize_2 = (wb.pimpl_.px)->freeSpace_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_188 == (undefined1  [8])bufsize_2);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,900,CHECK,CHECK_EQUAL,2,
             "bufsize - msg.size()",&local_a0,"wb.freeSpace()",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_a0.bufferImpl_.px = wb.pimpl_.px;
  local_a0.bufferImpl_.pn.pi_ = wb.pimpl_.pn.pi_;
  if (wb.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (wb.pimpl_.pn.pi_)->use_count_ = (wb.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_a0.iter_._M_cur =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_a0.iter_._M_first =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_a0.iter_._M_last =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_a0.iter_._M_node =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_a0.bytes_ = (wb.pimpl_.px)->size_;
  local_a0.chunkPos_ = 0;
  local_a0.bytesRemaining_ = local_a0.bytes_;
  avro::BufferReader::seek(&local_a0,5);
  avro::BufferReader::copyData((BufferReader *)&ib,(size_type)&local_a0);
  printBuffer(&ib);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x38c;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((ib.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ib.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ib.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ib.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ib.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ib.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_178 = iVar4;
  local_b0 = (_Elt_pointer)CONCAT44(local_b0._4_4_,1);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = local_a8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 1);
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x38c,CHECK,CHECK_EQUAL,2,
             "ib.numChunks()",(begin *)&ib_4,"1",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x38d;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)(ib.pimpl_.px)->size_;
  local_b0 = (_Elt_pointer)(msg._M_string_length - 10);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Elt_pointer)_local_178 == local_b0);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x38d,CHECK,CHECK_EQUAL,2,
             "ib.size()",(begin *)&ib_4,"msg.size()-10",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x390;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)msg._M_string_length;
  local_b0 = (_Elt_pointer)(wb.pimpl_.px)->size_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Elt_pointer)msg._M_string_length == local_b0);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x390,CHECK,CHECK_EQUAL,2,
             "msg.size()",(begin *)&ib_4,"wb.size()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x391;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 3);
  local_b0._0_4_ = 3;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_128.m_empty = false;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.px = local_a8;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  local_178 = iVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x391,CHECK,CHECK_EQUAL,2,
             "wb.numChunks()",(begin *)&ib_4,"3",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x392;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  local_178 = (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)((wb.pimpl_.px)->readChunks_).
                                 super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
              -0x49249249 +
              (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)((wb.pimpl_.px)->readChunks_).
                                 super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
              -0x49249249 +
              ((int)((ulong)((long)ppCVar1 -
                            (long)((wb.pimpl_.px)->readChunks_).
                                  super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_178 == 1);
  local_b0 = (_Elt_pointer)CONCAT44(local_b0._4_4_,1);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_128.m_empty = false;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.px = local_a8;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x392,CHECK,CHECK_EQUAL,2,
             "wb.numDataChunks()",(begin *)&ib_4,"1",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x393;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)(0xc000 - msg._M_string_length);
  local_b0 = (_Elt_pointer)(wb.pimpl_.px)->freeSpace_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((_Elt_pointer)_local_178 == local_b0);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x393,CHECK,CHECK_EQUAL,2,
             "bufsize - msg.size()",(begin *)&ib_4,"wb.freeSpace()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  peVar3 = wb.pimpl_.px;
  while (peVar3->freeSpace_ == 0) {
    avro::detail::BufferImpl::allocChunkChecked(peVar3,0x1000);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x397;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)msg._M_string_length;
  local_b0 = (_Elt_pointer)(wb.pimpl_.px)->size_;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((_Elt_pointer)msg._M_string_length == local_b0);
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x397,CHECK,CHECK_EQUAL,2,
             "msg.size()",(begin *)&ib_4,"wb.size()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x398;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_178 = iVar4;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 3);
  local_b0 = (_Elt_pointer)CONCAT44(local_b0._4_4_,3);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_128.m_empty = false;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.px = local_a8;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x398,CHECK,CHECK_EQUAL,2,
             "wb.numChunks()",(begin *)&ib_4,"3",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x399;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)(0xc000 - msg._M_string_length);
  local_b0 = (_Elt_pointer)(wb.pimpl_.px)->freeSpace_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((_Elt_pointer)_local_178 == local_b0);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x399,CHECK,CHECK_EQUAL,2,
             "bufsize - msg.size()",(begin *)&ib_4,"wb.freeSpace()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  peVar3 = wb.pimpl_.px;
  uVar2 = (wb.pimpl_.px)->freeSpace_;
  while (uVar2 < 0xc000) {
    size = 0xc000 - uVar2;
    if (0x3fff < size) {
      size = 0x4000;
    }
    if (size < 0x1001) {
      size = 0x1000;
    }
    avro::detail::BufferImpl::allocChunkChecked(peVar3,size);
    uVar2 = peVar3->freeSpace_;
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x39d;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)msg._M_string_length;
  local_b0 = (_Elt_pointer)(wb.pimpl_.px)->size_;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((_Elt_pointer)msg._M_string_length == local_b0);
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x39d,CHECK,CHECK_EQUAL,2,
             "msg.size()",(begin *)&ib_4,"wb.size()",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x39e;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_178 = iVar4;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 4);
  local_b0 = (_Elt_pointer)CONCAT44(local_b0._4_4_,4);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_128.m_empty = false;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.px = local_a8;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x39e,CHECK,CHECK_EQUAL,2,
             "wb.numChunks()",(begin *)&ib_4,"4",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3a0;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)(0xd000 - msg._M_string_length);
  local_b0 = (_Elt_pointer)(wb.pimpl_.px)->freeSpace_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((_Elt_pointer)_local_178 == local_b0);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  bufsize_2 = (size_type)&local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x3a0,CHECK,CHECK_EQUAL,2,
             "kMaxBlockSize * 3 - msg.size() + kMinBlockSize",(begin *)&ib_4,"wb.freeSpace()",
             &local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&local_a0.bufferImpl_.pn);
  boost::detail::shared_count::~shared_count(&wb.pimpl_.pn);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test3\n",6);
  bufsize = 0x2000;
  avro::OutputBuffer::OutputBuffer(&wb,0);
  iVar4 = 0x2000;
  do {
    avro::detail::BufferImpl::writeTo<char>(wb.pimpl_.px,'a',(true_type *)&local_a0);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3ad;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])(wb.pimpl_.px)->size_;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_188 == (undefined1  [8])bufsize);
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3ad,CHECK,CHECK_EQUAL,2,"wb.size()",
             &local_a0,"bufsize",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3ae;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])(wb.pimpl_.px)->freeSpace_;
  bufsize_2 = bufsize_2 & 0xffffffff00000000;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188 == (undefined1  [8])0x0);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd838;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3ae,CHECK,CHECK_EQUAL,2,
             "wb.freeSpace()",&local_a0,"0U",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3af;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  bufsize_2 = bufsize_2 & 0xffffffff00000000;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.px = local_a8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.px = local_a8;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  local_188._0_4_ = iVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3af,CHECK,CHECK_EQUAL,2,
             "wb.numChunks()",&local_a0,"0",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3b0;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  local_188._0_4_ =
       (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)((wb.pimpl_.px)->readChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
       (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)((wb.pimpl_.px)->readChunks_).
                          super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249 +
       ((int)((ulong)((long)ppCVar1 -
                     (long)((wb.pimpl_.px)->readChunks_).
                           super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
       (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = local_a8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_188._0_4_ == 2);
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  bufsize_2 = CONCAT44(bufsize_2._4_4_,2);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.px = local_a8;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  wb_3.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb_3;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3b0,CHECK,CHECK_EQUAL,2,
             "wb.numDataChunks()",&local_a0,"2",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_a0.bufferImpl_.px = wb.pimpl_.px;
  local_a0.bufferImpl_.pn.pi_ = wb.pimpl_.pn.pi_;
  if (wb.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (wb.pimpl_.pn.pi_)->use_count_ = (wb.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_a0.iter_._M_cur =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_a0.iter_._M_first =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_a0.iter_._M_last =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_a0.iter_._M_node =
       ((wb.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_a0.bytes_ = (wb.pimpl_.px)->size_;
  local_a0.chunkPos_ = 0;
  local_a0.bytesRemaining_ = local_a0.bytes_;
  avro::BufferReader::seek(&local_a0,0xff6);
  avro::BufferReader::copyData((BufferReader *)&ib,(size_type)&local_a0);
  printBuffer(&ib);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3b9;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)(ib.pimpl_.px)->size_;
  local_b0._0_4_ = 0x14;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  bufsize_2 = (size_type)&local_b0;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd838;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((_Elt_pointer)_local_178 == (_Elt_pointer)0x14);
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x3b9,CHECK,CHECK_EQUAL,2,
             "ib.size()",(begin *)&ib_4,"20U",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3ba;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((ib.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((ib.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ib.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ib.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ib.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ib.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_178 = iVar4;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 2);
  local_b0._0_4_ = 2;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_128.m_empty = false;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.px = local_a8;
  bufsize_2 = (size_type)&local_b0;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x3ba,CHECK,CHECK_EQUAL,2,
             "ib.numChunks()",(begin *)&ib_4,"2",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3bd;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)(wb.pimpl_.px)->size_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_local_178 == (sp_counted_base *)bufsize);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  bufsize_2 = (size_type)&bufsize;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x3bd,CHECK,CHECK_EQUAL,2,
             "wb.size()",(begin *)&ib_4,"bufsize",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3be;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  _local_178 = (sp_counted_base *)(wb.pimpl_.px)->freeSpace_;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((_Elt_pointer)_local_178 == (_Elt_pointer)0x0);
  local_b0._0_4_ = 0;
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  bufsize_2 = (size_type)&local_b0;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd838;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x3be,CHECK,CHECK_EQUAL,2,
             "wb.freeSpace()",(begin *)&ib_4,"0U",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3bf;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001dd7b8;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 2);
  bufsize_2 = (size_type)&local_b0;
  local_b0 = (_Elt_pointer)CONCAT44(local_b0._4_4_,2);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_128.m_empty = false;
  wb_3.pimpl_.px = (element_type *)anon_var_dwarf_a34dc;
  wb_3.pimpl_.pn.pi_ = (sp_counted_base *)0x1b417e;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.px = local_a8;
  local_128._vptr_lazy_ostream = (_func_int **)local_a8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)&bufsize_2;
  local_178 = iVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,(lazy_ostream *)&local_d0,(const_string *)&wb_3,0x3bf,CHECK,CHECK_EQUAL,2,
             "wb.numDataChunks()",(begin *)&ib_4,"2",&local_128);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  boost::detail::shared_count::~shared_count(&ib.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&local_a0.bufferImpl_.pn);
  boost::detail::shared_count::~shared_count(&wb.pimpl_.pn);
  bufsize_2 = 0x8000;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test4\n",6);
  avro::OutputBuffer::OutputBuffer(&wb_3,0x8000);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3c7;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb_3.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb_3.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb_3.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb_3.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb_3.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb_3.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_188._0_4_ = iVar4;
  bufsize = CONCAT44(bufsize._4_4_,2);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.px = local_a8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize;
  ib_4.pimpl_.px = local_a8;
  wb.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 2);
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3c7,CHECK,CHECK_EQUAL,2,
             "wb.numChunks()",&local_a0,"2",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3c8;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])(wb_3.pimpl_.px)->size_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188 == (undefined1  [8])0x0);
  bufsize = bufsize & 0xffffffff00000000;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd838;
  wb.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3c8,CHECK,CHECK_EQUAL,2,"wb.size()",
             &local_a0,"0U",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3c9;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  local_188 = (undefined1  [8])(wb_3.pimpl_.px)->freeSpace_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188 == (undefined1  [8])bufsize_2);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  ib.pimpl_.px = (element_type *)&bufsize_2;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  wb.pimpl_.px = (element_type *)local_188;
  local_a0.iter_._M_first = (_Elt_pointer)&wb;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3c9,CHECK,CHECK_EQUAL,2,
             "wb.freeSpace()",&local_a0,"bufsize",(begin *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  avro::InputBuffer::InputBuffer((InputBuffer *)&wb);
  local_a0.bufferImpl_.px = wb_3.pimpl_.px;
  local_a0.bufferImpl_.pn.pi_ = wb_3.pimpl_.pn.pi_;
  if (wb_3.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (wb_3.pimpl_.pn.pi_)->use_count_ = (wb_3.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_a0.iter_._M_cur =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_a0.iter_._M_first =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_a0.iter_._M_last =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_a0.iter_._M_node =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_a0.bytes_ = (wb_3.pimpl_.px)->size_;
  local_a0.chunkPos_ = 0;
  local_a0.bytesRemaining_ = local_a0.bytes_;
  avro::BufferReader::seek(&local_a0,10);
  boost::detail::shared_count::~shared_count(&local_a0.bufferImpl_.pn);
  local_a0.bufferImpl_.px = wb_3.pimpl_.px;
  local_a0.bufferImpl_.pn.pi_ = wb_3.pimpl_.pn.pi_;
  if (wb_3.pimpl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (wb_3.pimpl_.pn.pi_)->use_count_ = (wb_3.pimpl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_a0.iter_._M_cur =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_a0.iter_._M_first =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_a0.iter_._M_last =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_a0.iter_._M_node =
       ((wb_3.pimpl_.px)->readChunks_).
       super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_a0.bytes_ = (wb_3.pimpl_.px)->size_;
  local_a0.chunkPos_ = 0;
  local_a0.bytesRemaining_ = local_a0.bytes_;
  avro::BufferReader::copyData((BufferReader *)&ib_4,(size_type)&local_a0);
  boost::detail::shared_count::~shared_count(&ib_4.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&local_a0.bufferImpl_.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3dc;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  bufsize = CONCAT44(bufsize._4_4_,iVar4);
  local_178 = 0;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  ib.pimpl_.px = (element_type *)&bufsize;
  local_a0.bufferImpl_.px = local_a8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.px = local_a8;
  local_a0.iter_._M_first = (_Elt_pointer)&ib;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3dc,CHECK,CHECK_EQUAL,2,
             "ib.numChunks()",&local_a0,"0",(BufferReader *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3dd;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  bufsize = (wb.pimpl_.px)->size_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bufsize == 0);
  local_178 = 0;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  ib.pimpl_.px = (element_type *)&bufsize;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd838;
  local_a0.iter_._M_first = (_Elt_pointer)&ib;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3dd,CHECK,CHECK_EQUAL,2,"ib.size()",
             &local_a0,"0U",(BufferReader *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3e0;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  ppCVar1 = ((wb_3.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar4 = (int)((ulong)((long)((wb_3.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((wb_3.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((wb_3.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((wb_3.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((wb_3.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  bufsize = CONCAT44(bufsize._4_4_,iVar4);
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 2);
  local_178 = 2;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0.bufferImpl_.px = local_a8;
  ib_4.pimpl_.px = local_a8;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  ib.pimpl_.px = (element_type *)&bufsize;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  local_a0.iter_._M_first = (_Elt_pointer)&ib;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3e0,CHECK,CHECK_EQUAL,2,
             "wb.numChunks()",&local_a0,"2",(BufferReader *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3e1;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  bufsize = (wb_3.pimpl_.px)->size_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bufsize == 0);
  _local_178 = (sp_counted_base *)((ulong)uStack_174 << 0x20);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  ib.pimpl_.px = (element_type *)&bufsize;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_188 = (undefined1  [8])&stack0xfffffffffffffe88;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd838;
  local_a0.iter_._M_first = (_Elt_pointer)&ib;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3e1,CHECK,CHECK_EQUAL,2,"wb.size()",
             &local_a0,"0U",(BufferReader *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3e2;
  local_128.m_empty = false;
  local_128._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_118 = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_110 = (_Elt_pointer)0x1b389c;
  bufsize = (wb_3.pimpl_.px)->freeSpace_;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bufsize == bufsize_2);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_140.m_message.px = (element_type *)0x1b417e;
  ib.pimpl_.px = (element_type *)&bufsize;
  local_a0.bufferImpl_.pn.pi_ = local_a0.bufferImpl_.pn.pi_ & 0xffffffffffffff00;
  local_a0.bufferImpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_cur = (_Elt_pointer)&boost::unit_test::lazy_ostream::inst;
  local_188 = (undefined1  [8])&bufsize_2;
  ib_4.pimpl_.pn.pi_ = ib_4.pimpl_.pn.pi_ & 0xffffffffffffff00;
  ib_4.pimpl_.px = (element_type *)&PTR__lazy_ostream_001dd7f8;
  local_a0.iter_._M_first = (_Elt_pointer)&ib;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_128,(const_string *)&local_140,0x3e2,CHECK,CHECK_EQUAL,2,
             "wb.freeSpace()",&local_a0,"bufsize",(BufferReader *)&ib_4);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::detail::shared_count::~shared_count(&wb.pimpl_.pn);
  boost::detail::shared_count::~shared_count(&wb_3.pimpl_.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != &msg.field_2) {
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestCopy() 
{
    BOOST_TEST_MESSAGE( "TestCopy");

    const std::string msg = makeString(30);
    // Test1, small data, small buffer
    {
        std::cout << "Test1\n";
        // put a small amount of data in the buffer
        avro::OutputBuffer wb;

        wb.writeTo(msg.c_str(), msg.size());

        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(kDefaultBlockSize - msg.size(), 
                wb.freeSpace());

        // copy starting at offset 5 and copying 10 less bytes
        BufferReader br(wb);
        br.seek(5);
        avro::InputBuffer ib = br.copyData(msg.size() - 10);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.numChunks(), 1);
        BOOST_CHECK_EQUAL(ib.size(), msg.size()-10);

        // buf 1 should be unchanged
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(kDefaultBlockSize - msg.size(), 
                wb.freeSpace());

        // make sure wb is still functional
        wb.reserve(kDefaultBlockSize);
        BOOST_CHECK_EQUAL(wb.size(), msg.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(kDefaultBlockSize * 2 - msg.size(), 
                wb.freeSpace());
    }

    // Test2, small data, large buffer
    {
        std::cout << "Test2\n";
        // put a small amount of data in the buffer
        const OutputBuffer::size_type bufsize= 3*kMaxBlockSize;

        avro::OutputBuffer wb(bufsize);
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);

        wb.writeTo(msg.c_str(), msg.size());

        BOOST_CHECK_EQUAL(wb.size(), msg.size());
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), 
                wb.freeSpace());

        BufferReader br(wb);
        br.seek(5);
        avro::InputBuffer ib = br.copyData(msg.size() - 10);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.numChunks(), 1);
        BOOST_CHECK_EQUAL(ib.size(), msg.size()-10);

        // wb should be unchanged
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 1);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), wb.freeSpace());

        // reserving a small amount should have no effect
        wb.reserve(1);
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 3);
        BOOST_CHECK_EQUAL(bufsize - msg.size(), wb.freeSpace());

        // reserve more (will get extra block)
        wb.reserve(bufsize);
        BOOST_CHECK_EQUAL(msg.size(), wb.size());
        BOOST_CHECK_EQUAL(wb.numChunks(), 4);
        BOOST_CHECK_EQUAL(kMaxBlockSize * 3 - msg.size() + kMinBlockSize, 
                wb.freeSpace());
    }

    // Test3 Border case, buffer is exactly full
    {
        std::cout << "Test3\n";
        const OutputBuffer::size_type bufsize= 2*kDefaultBlockSize;
        avro::OutputBuffer wb;

        for(unsigned i = 0; i < bufsize; ++i) {
            wb.writeTo('a');
        }

        BOOST_CHECK_EQUAL(wb.size(), bufsize);
        BOOST_CHECK_EQUAL(wb.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(wb.numChunks(), 0);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 2);

        // copy where the chunks overlap
        BufferReader br(wb);
        br.seek(bufsize/2 - 10);
        avro::InputBuffer ib = br.copyData(20);

        printBuffer(ib);

        BOOST_CHECK_EQUAL(ib.size(), 20U);
        BOOST_CHECK_EQUAL(ib.numChunks(), 2);

        // wb should be unchanged
        BOOST_CHECK_EQUAL(wb.size(), bufsize);
        BOOST_CHECK_EQUAL(wb.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(wb.numDataChunks(), 2);
    }

    // Test4, no data 
    {
        const OutputBuffer::size_type bufsize= 2*kMaxBlockSize;
        std::cout << "Test4\n";
        avro::OutputBuffer wb(bufsize);
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(wb.size(), 0U);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);

        avro::InputBuffer ib;
        try {
            BufferReader br(wb);
            br.seek(10);
        }
        catch (std::exception &e) {
            cout << "Intentially triggered exception: " << e.what() << endl;
        }
        try {
            BufferReader br(wb);
            avro::InputBuffer ib = br.copyData(10);
        }
        catch (std::exception &e) {
            cout << "Intentially triggered exception: " << e.what() << endl;
        }


        BOOST_CHECK_EQUAL(ib.numChunks(), 0);
        BOOST_CHECK_EQUAL(ib.size(), 0U);

        // wb should keep all blocks remaining
        BOOST_CHECK_EQUAL(wb.numChunks(), 2);
        BOOST_CHECK_EQUAL(wb.size(), 0U);
        BOOST_CHECK_EQUAL(wb.freeSpace(), bufsize);
    }
}